

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  ostringstream *poVar1;
  FillRuleCaseType FVar2;
  uint uVar3;
  TestLog *pTVar4;
  FillRuleCase *pFVar5;
  long *plVar6;
  undefined8 *puVar7;
  RenderTarget *pRVar8;
  long lVar9;
  undefined4 extraout_var;
  size_type *psVar10;
  ulong *puVar11;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  char *description;
  long lVar13;
  IterateResult IVar14;
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  int row;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  Random rnd;
  float local_334;
  float local_330;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_328;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  string local_2f8;
  string local_2d8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  string local_2a8;
  LogImageSet local_288;
  Surface local_248;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  string local_220;
  string local_200;
  ulong local_1e0;
  FillRuleCase *local_1d8;
  ScopedLogSection local_1d0;
  long local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar25 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar25 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x6413d0);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2a8.field_2._M_allocated_capacity = *psVar10;
    local_2a8.field_2._8_8_ = plVar6[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar10;
    local_2a8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2a8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  paVar20 = &local_288.m_name.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_288.m_name.field_2._M_allocated_capacity = *puVar11;
    local_288.m_name.field_2._8_8_ = plVar6[3];
    local_288.m_name._M_dataplus._M_p = (pointer)paVar20;
  }
  else {
    local_288.m_name.field_2._M_allocated_capacity = *puVar11;
    local_288.m_name._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_288.m_name._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar20) {
    uVar15 = local_288.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_288.m_name._M_string_length + local_2f8._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      uVar15 = local_2f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_288.m_name._M_string_length + local_2f8._M_string_length)
    goto LAB_0035b0d7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_288.m_name._M_dataplus._M_p);
  }
  else {
LAB_0035b0d7:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2f8._M_dataplus._M_p);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_200.field_2._M_allocated_capacity = *psVar10;
    local_200.field_2._8_8_ = puVar7[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar10;
    local_200._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_200._M_string_length = puVar7[1];
  *puVar7 = psVar10;
  puVar7[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar20) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1d0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_200,&local_200);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar24 = 1 << (8U - (char)(pRVar8->m_pixelFormat).redBits & 0x1f);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar22 = 1 << (8U - (char)(pRVar8->m_pixelFormat).greenBits & 0x1f);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_2b0 = 1 << (8U - (char)(pRVar8->m_pixelFormat).blueBits & 0x1f);
  iVar25 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_248,iVar25,iVar25);
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar2 = this->m_caseType;
  local_2b4 = iVar22;
  local_2ac = iVar24;
  if (FVar2 < FILLRULECASE_LAST) {
    iVar25 = this->m_iteration;
    if ((0x13U >> (FVar2 & 0x1f) & 1) == 0) {
      fVar26 = ((float)iVar25 / (float)(this->m_iterationCount + -1)) * 3.1415927 * 0.5;
      fVar28 = cosf(fVar26);
      fVar26 = sinf(fVar26);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_328,6);
      if (FVar2 == FILLRULECASE_CLIPPED_PARTIAL) {
        fVar32 = 0.5;
      }
      else {
        fVar32 = 0.0;
      }
      fVar26 = fVar26 * *(float *)(&DAT_00640c94 +
                                  (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      fVar28 = fVar28 * *(float *)(&DAT_00640c94 +
                                  (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      fVar30 = fVar28 + (fVar32 - fVar26);
      fVar29 = (fVar32 - fVar28) - fVar26;
      fVar31 = (fVar32 + fVar26) - fVar28;
      fVar27 = fVar32 + fVar28 + fVar26;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = fVar27;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = fVar31;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = (fVar32 + fVar28) - fVar26;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = fVar28 + fVar32 + fVar26;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = fVar29;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = fVar30;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = fVar29;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = fVar30;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = fVar27;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = fVar31;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = fVar26 + (fVar32 - fVar28);
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = (fVar32 - fVar26) - fVar28;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)local_1b8,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_328,0x60);
      iVar25 = iVar25 << 4;
      lVar19 = 0;
      lVar23 = 0;
      lVar9 = 0;
      local_1d8 = this;
      do {
        fVar26 = ((float)(int)lVar9 + 0.5) * 0.25;
        local_224 = fVar26 + fVar26 + -1.0;
        local_1e0 = lVar9 * 4;
        lVar13 = 0;
        uVar21 = 0;
        local_1c8 = lVar9;
        local_1c0 = lVar23;
        do {
          pFVar5 = local_1d8;
          fVar26 = ((float)(int)uVar21 + 0.5) * 0.25;
          local_334 = fVar26 + fVar26 + -1.0;
          fVar26 = ((float)(iVar25 + (int)uVar21) / (float)(local_1d8->m_iterationCount << 4)) *
                   3.1415927 * 0.5;
          local_330 = cosf(fVar26);
          fVar26 = sinf(fVar26);
          local_330 = local_330 * 0.15;
          fVar26 = fVar26 * 0.15;
          local_308 = local_330 + local_334;
          local_2fc = fVar26 + local_308;
          local_308 = local_308 - fVar26;
          local_30c = local_330 + local_224 + fVar26;
          fVar28 = (local_224 + fVar26) - local_330;
          local_334 = local_334 - local_330;
          local_304 = local_334 - fVar26;
          local_300 = local_330 + (local_224 - fVar26);
          local_334 = local_334 + fVar26;
          local_330 = (local_224 - fVar26) - local_330;
          FVar2 = pFVar5->m_caseType;
          if (FVar2 == FILLRULECASE_PROJECTED) {
            fVar26 = deRandom_getFloat((deRandom *)local_1b8);
            local_228 = fVar26 * 3.9 + 0.1;
            fVar26 = deRandom_getFloat((deRandom *)local_1b8);
            local_230 = fVar26 * 3.9 + 0.1;
            local_22c = deRandom_getFloat((deRandom *)local_1b8);
            fVar26 = deRandom_getFloat((deRandom *)local_1b8);
            fVar32 = local_22c * 3.9 + 0.1;
            fVar26 = fVar26 * 3.9 + 0.1;
            lVar9 = (uVar21 | local_1e0) * 6;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + lVar19)
                 = local_2fc * local_228;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar13 + 4 + lVar19) = fVar28 * local_228;
            *(undefined4 *)
             ((long)(local_328.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8 + lVar19) = 0;
            *(float *)((long)(local_328.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar13 + 0xc + lVar19) = local_228;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar13)
                 = local_308 * local_230;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar13 + lVar19 + 4) = local_30c * local_230;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar13 + lVar19 + 0xc) = local_230;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar13)
                 = local_304 * fVar32;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar13 + lVar19 + 4) = local_300 * fVar32;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar13 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar13 + lVar19 + 0xc) = fVar32;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar13)
                 = local_304 * fVar32;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar13 + lVar19 + 4) = local_300 * fVar32;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar13 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar13 + lVar19 + 0xc) = fVar32;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar13)
                 = local_2fc * local_228;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar13 + lVar19 + 4) = fVar28 * local_228;
            *(undefined4 *)
             ((long)local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar13 + lVar19 + 8) = 0;
            *(float *)((long)local_328.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar13 + lVar19 + 0xc) = local_228;
            local_334 = local_334 * fVar26;
            local_330 = local_330 * fVar26;
LAB_0035b75f:
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar9 + 5].m_data[0] = local_334;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar9 + 5].m_data[1] = local_330;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar9 + 5].m_data[2] = 0.0;
            local_328.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar9 + 5].m_data[3] = fVar26;
          }
          else {
            if (FVar2 == FILLRULECASE_REVERSED) {
              lVar9 = (uVar21 | local_1e0) * 6;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + lVar19
                        ) = local_2fc;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar13 + 4 + lVar19) = fVar28;
              *(undefined8 *)
               ((long)(local_328.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8 + lVar19) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar13
                        ) = local_308;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar13 + lVar19 + 4) = local_30c;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar13
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar13 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar13
                        ) = local_2fc;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar13 + lVar19 + 4) = fVar28;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar13
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar13 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
LAB_0035b5af:
              fVar26 = 1.0;
              goto LAB_0035b75f;
            }
            if (FVar2 == FILLRULECASE_BASIC) {
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + lVar19
                        ) = local_2fc;
              *(float *)((long)(local_328.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar13 + 4 + lVar19) = fVar28;
              *(undefined8 *)
               ((long)(local_328.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8 + lVar19) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar19 + lVar13
                        ) = local_308;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar13 + lVar19 + 4) = local_30c;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar19 + lVar13
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar13 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar19 + lVar13
                        ) = local_304;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar13 + lVar19 + 4) = local_300;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar19 + lVar13
                        ) = local_2fc;
              *(float *)((long)local_328.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar13 + lVar19 + 4) = fVar28;
              *(undefined8 *)
               ((long)local_328.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar13 + lVar19 + 8) =
                   0x3f80000000000000;
              lVar9 = lVar23;
              goto LAB_0035b5af;
            }
          }
          uVar21 = uVar21 + 1;
          lVar23 = lVar23 + 6;
          lVar13 = lVar13 + 0x60;
        } while (lVar13 != 0x180);
        lVar9 = local_1c8 + 1;
        lVar23 = local_1c0 + 0x18;
        lVar19 = lVar19 + 0x180;
        iVar25 = iVar25 + 4;
        this = local_1d8;
      } while (lVar9 != 4);
    }
  }
  paVar20 = &local_2a8.field_2;
  iVar25 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar25);
  local_1b8._0_8_ = (TestLog *)0x3f0000003f000000;
  local_1b8._8_8_ = 0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_328.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1b8,
             (allocator_type *)&local_2a8);
  local_1b8._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar9 + 0x5e0))(0xbe2);
  (**(code **)(lVar9 + 0x100))(0x8006);
  (**(code **)(lVar9 + 0x120))(1,1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_248,&local_328,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,4)
  ;
  iVar25 = local_2ac;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity -
                    (long)local_288.m_name._M_dataplus._M_p);
  }
  local_1b8._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  if (local_248.m_height < 1) {
LAB_0035bdba:
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    bVar16 = false;
  }
  else {
    iVar22 = 0;
    iVar24 = 0;
    bVar16 = false;
    do {
      uVar21 = (ulong)(uint)local_248.m_width;
      iVar18 = iVar22;
      if (0 < local_248.m_width) {
        do {
          uVar3 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar18 * 4);
          if (((iVar25 < (int)((uVar3 & 0xff) - 0x7f)) ||
              (local_2b4 < (int)((uVar3 >> 8 & 0xff) - 0x7f))) ||
             (local_2b0 < (int)((uVar3 >> 0x10 & 0xff) - 0x7f))) {
            bVar16 = true;
          }
          iVar18 = iVar18 + 1;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      iVar24 = iVar24 + 1;
      iVar22 = iVar22 + local_248.m_width;
    } while (iVar24 != local_248.m_height);
    if (!bVar16) goto LAB_0035bdba;
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pTVar4 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    local_2a8._M_dataplus._M_p = (pointer)paVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Result of rendering","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_288,&local_2a8,&local_2d8);
    tcu::TestLog::startImageSet
              (pTVar4,local_288.m_name._M_dataplus._M_p,local_288.m_description._M_dataplus._M_p);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Result","");
    pSVar12 = &local_248;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2f8,&local_220,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar4,__buf,(size_t)pSVar12);
    tcu::TestLog::endImageSet(pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.m_description._M_dataplus._M_p != &local_288.m_description.field_2) {
      operator_delete(local_288.m_description._M_dataplus._M_p,
                      local_288.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
      operator_delete(local_288.m_name._M_dataplus._M_p,
                      local_288.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar20) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    this->m_allIterationsPassed = false;
    bVar16 = true;
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    if (0 < local_248.m_height) {
      iVar25 = 0;
      iVar22 = 0;
      bVar17 = false;
      do {
        uVar21 = (ulong)(uint)local_248.m_width;
        iVar24 = iVar25;
        if (0 < local_248.m_width) {
          do {
            uVar3 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar24 * 4);
            if ((((int)(uVar3 & 0xff) <= local_2ac) || ((int)(uVar3 >> 8 & 0xff) <= local_2b4)) ||
               ((int)(uVar3 >> 0x10 & 0xff) <= local_2b0)) {
              bVar17 = true;
            }
            iVar24 = iVar24 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        iVar22 = iVar22 + 1;
        iVar25 = iVar25 + local_248.m_width;
      } while (iVar22 != local_248.m_height);
      if (bVar17) {
        local_1b8._0_8_ =
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        if (!bVar16) {
          pTVar4 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
          local_2a8._M_dataplus._M_p = (pointer)paVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"Result of rendering","");
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"Result of rendering","");
          tcu::LogImageSet::LogImageSet(&local_288,&local_2a8,&local_2d8);
          tcu::TestLog::startImageSet
                    (pTVar4,local_288.m_name._M_dataplus._M_p,
                     local_288.m_description._M_dataplus._M_p);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Result","");
          pSVar12 = &local_248;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_2f8,&local_220,pSVar12,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar4,__buf_00,(size_t)pSVar12);
          tcu::TestLog::endImageSet(pTVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.m_description._M_dataplus._M_p != &local_288.m_description.field_2) {
            operator_delete(local_288.m_description._M_dataplus._M_p,
                            local_288.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
            operator_delete(local_288.m_name._M_dataplus._M_p,
                            local_288.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar20) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        this->m_allIterationsPassed = false;
        goto LAB_0035c1d9;
      }
    }
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
LAB_0035c1d9:
  iVar25 = this->m_iteration + 1;
  this->m_iteration = iVar25;
  IVar14 = CONTINUE;
  if (iVar25 == this->m_iterationCount) {
    description = "Found invalid pixels";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar14 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_328.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_248);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return IVar14;
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}